

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect.hpp
# Opt level: O2

iterator_range<burst::semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_std::greater<void>_>_>
* __thiscall
burst::semiintersect_t::operator()
          (iterator_range<burst::semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_std::greater<void>_>_>
           *__return_storage_ptr__,semiintersect_t *this,
          tuple<std::vector<int,_std::allocator<int>_>_&,_std::__cxx11::list<int,_std::allocator<int>_>_&,_std::deque<int,_std::allocator<int>_>_&>
          *args,int *args_1,greater<void> *args_2)

{
  semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_std::greater<void>_>
  end;
  semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_std::greater<void>_>
  begin;
  semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_std::greater<void>_>
  sStack_138;
  semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_std::greater<void>_>
  local_f8;
  semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_std::greater<void>_>
  local_b8;
  semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_std::greater<void>_>
  local_78;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  vector<int,_std::allocator<int>_> *local_28;
  
  local_38 = *(undefined4 *)
              &(args->
               super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_&,_std::__cxx11::list<int,_std::allocator<int>_>_&,_std::deque<int,_std::allocator<int>_>_&>
               ).
               super__Tuple_impl<1UL,_std::__cxx11::list<int,_std::allocator<int>_>_&,_std::deque<int,_std::allocator<int>_>_&>
               .super__Tuple_impl<2UL,_std::deque<int,_std::allocator<int>_>_&>.
               super__Head_base<2UL,_std::deque<int,_std::allocator<int>_>_&,_false>._M_head_impl;
  uStack_34 = *(undefined4 *)
               ((long)&(args->
                       super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_&,_std::__cxx11::list<int,_std::allocator<int>_>_&,_std::deque<int,_std::allocator<int>_>_&>
                       ).
                       super__Tuple_impl<1UL,_std::__cxx11::list<int,_std::allocator<int>_>_&,_std::deque<int,_std::allocator<int>_>_&>
                       .super__Tuple_impl<2UL,_std::deque<int,_std::allocator<int>_>_&>.
                       super__Head_base<2UL,_std::deque<int,_std::allocator<int>_>_&,_false>.
                       _M_head_impl + 4);
  uStack_30 = *(undefined4 *)
               &(args->
                super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_&,_std::__cxx11::list<int,_std::allocator<int>_>_&,_std::deque<int,_std::allocator<int>_>_&>
                ).
                super__Tuple_impl<1UL,_std::__cxx11::list<int,_std::allocator<int>_>_&,_std::deque<int,_std::allocator<int>_>_&>
                .super__Head_base<1UL,_std::__cxx11::list<int,_std::allocator<int>_>_&,_false>.
                _M_head_impl;
  uStack_2c = *(undefined4 *)
               ((long)&(args->
                       super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_&,_std::__cxx11::list<int,_std::allocator<int>_>_&,_std::deque<int,_std::allocator<int>_>_&>
                       ).
                       super__Tuple_impl<1UL,_std::__cxx11::list<int,_std::allocator<int>_>_&,_std::deque<int,_std::allocator<int>_>_&>
                       .
                       super__Head_base<1UL,_std::__cxx11::list<int,_std::allocator<int>_>_&,_false>
                       ._M_head_impl + 4);
  local_28 = (args->
             super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_&,_std::__cxx11::list<int,_std::allocator<int>_>_&,_std::deque<int,_std::allocator<int>_>_&>
             ).super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>_&,_false>._M_head_impl;
  make_semiintersect_iterator<std::vector<int,std::allocator<int>>,std::__cxx11::list<int,std::allocator<int>>,std::deque<int,std::allocator<int>>,int,std::greater<void>>
            (&local_78,(burst *)&local_38,*args_1);
  semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_std::greater<void>_>
  ::semiintersect_iterator(&local_b8,&local_78);
  semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_std::greater<void>_>
  ::semiintersect_iterator(&local_f8,&local_78);
  semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_std::greater<void>_>
  ::semiintersect_iterator(&sStack_138,&local_b8);
  boost::
  make_iterator_range<burst::semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_List_iterator<int>,std::_Deque_iterator<int,int&,int*>>>,std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_List_iterator<int>,std::_Deque_iterator<int,int&,int*>>>>>>,std::greater<void>>>
            (__return_storage_ptr__,(boost *)&local_f8,&sStack_138,
             (semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_std::greater<void>_>
              *)args_1);
  semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_std::greater<void>_>
  ::~semiintersect_iterator(&sStack_138);
  semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_std::greater<void>_>
  ::~semiintersect_iterator(&local_f8);
  semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_std::greater<void>_>
  ::~semiintersect_iterator(&local_b8);
  semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_std::greater<void>_>
  ::~semiintersect_iterator(&local_78);
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Args && ... args) const
        {
            auto begin = make_semiintersect_iterator(std::forward<Args>(args)...);
            auto end = make_semiintersect_iterator(iterator::end_tag, begin);

            return boost::make_iterator_range(std::move(begin), std::move(end));
        }